

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O2

DWORD SearchPathA(LPCSTR lpPath,LPCSTR lpFileName,LPCSTR lpExtension,DWORD nBufferLength,
                 LPSTR lpBuffer,LPSTR *lpFilePart)

{
  ulong count;
  long lVar1;
  DWORD nBufferLength_00;
  int iVar2;
  errno_t eVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  byte bVar7;
  DWORD dwErrCode;
  size_t sVar8;
  long in_FS_OFFSET;
  DWORD local_c4;
  undefined1 local_b8 [8];
  PathCharString CanonicalFullPathPS;
  PathCharString FullPathPS;
  
  bVar7 = PAL_InitializeChakraCoreCalled;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FullPathPS.m_size = 0;
  CanonicalFullPathPS._32_8_ = local_b8;
  CanonicalFullPathPS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002da0c4;
  if (lpPath == (LPCSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x466);
    pcVar5 = "lpPath may not be NULL\n";
LAB_002d9c7b:
    fprintf(_stderr,pcVar5);
    dwErrCode = 0x57;
LAB_002d9c8f:
    SetLastError(dwErrCode);
LAB_002d9c96:
    nBufferLength_00 = 0;
  }
  else {
    if (lpFileName == (LPCSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x46c);
      pcVar5 = "lpFileName may not be NULL\n";
      goto LAB_002d9c7b;
    }
    if (lpExtension != (LPCSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x472);
      fprintf(_stderr,"lpExtension must be NULL, is %p instead\n",lpExtension);
      dwErrCode = 0x57;
      goto LAB_002d9c8f;
    }
    sVar4 = strlen(lpFileName);
    if ((*lpFileName == '/') || (*lpFileName == '\\')) {
      if (sVar4 < 0x400) {
        pcVar5 = StackString<32UL,_char>::OpenStringBuffer
                           ((StackString<32UL,_char> *)local_b8,0x400);
        dwErrCode = 8;
        if (pcVar5 != (char *)0x0) {
          nBufferLength_00 = GetFullPathNameA(lpFileName,0x401,pcVar5,(LPSTR *)0x0);
          if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
            CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
          }
          *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
          if (0x401 < nBufferLength_00) {
            pcVar5 = StackString<32UL,_char>::OpenStringBuffer
                               ((StackString<32UL,_char> *)local_b8,(ulong)(nBufferLength_00 - 1));
            if (pcVar5 == (char *)0x0) goto LAB_002d9c8f;
            nBufferLength_00 = GetFullPathNameA(lpFileName,nBufferLength_00,pcVar5,(LPSTR *)0x0);
            if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
              CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
            }
            *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
          }
          if (nBufferLength_00 == 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_002da0c4;
            GetLastError();
            dwErrCode = 0x57;
          }
          else {
            iVar2 = access(pcVar5,0);
            dwErrCode = 2;
            if (iVar2 == 0) goto LAB_002d9df0;
          }
        }
      }
      else {
        dwErrCode = 0x57;
      }
      goto LAB_002d9c8f;
    }
    local_c4 = 8;
LAB_002d9e4d:
    do {
      do {
        while( true ) {
          pcVar5 = lpPath;
          if (*pcVar5 == '\0') {
            dwErrCode = 2;
            goto LAB_002d9c8f;
          }
          pcVar6 = strchr(pcVar5,0x3a);
          if (pcVar6 == (char *)0x0) {
            sVar8 = strlen(pcVar5);
            pcVar6 = pcVar5 + sVar8;
            lpPath = pcVar6;
          }
          else {
            lpPath = pcVar6 + 1;
          }
          sVar8 = (long)pcVar6 - (long)pcVar5;
          count = sVar4 + 1 + sVar8;
          if (count < 0x400) break;
          if ((bVar7 & 1) == 0) goto LAB_002da0c4;
        }
      } while (pcVar6 == pcVar5);
      pcVar6 = StackString<32UL,_char>::OpenStringBuffer
                         ((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count,count);
      if (pcVar6 == (char *)0x0) {
LAB_002da072:
        SetLastError(local_c4);
        goto LAB_002d9c96;
      }
      memcpy(pcVar6,pcVar5,sVar8);
      pcVar6[sVar8] = '/';
      eVar3 = strcpy_s(pcVar6 + sVar8 + 1,sVar4 + 1,lpFileName);
      if (eVar3 != 0) {
        local_c4 = 0xce;
        if (PAL_InitializeChakraCoreCalled != false) goto LAB_002da072;
        goto LAB_002da0c4;
      }
      if (count < FullPathPS.m_size) {
        FullPathPS.m_size = count;
      }
      CanonicalFullPathPS.m_innerBuffer[FullPathPS.m_size + 0x38] = '\0';
      pcVar5 = StackString<32UL,_char>::OpenStringBuffer((StackString<32UL,_char> *)local_b8,0x400);
      if (pcVar5 == (char *)0x0) goto LAB_002da072;
      nBufferLength_00 = GetFullPathNameA(pcVar6,0x401,pcVar5,(LPSTR *)0x0);
      if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
        CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
      }
      *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
      if (0x401 < nBufferLength_00) {
        pcVar5 = StackString<32UL,_char>::OpenStringBuffer
                           ((StackString<32UL,_char> *)local_b8,(ulong)(nBufferLength_00 - 1));
        nBufferLength_00 = GetFullPathNameA(pcVar6,nBufferLength_00,pcVar5,(LPSTR *)0x0);
        if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
          CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
        }
        *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
      }
      if (nBufferLength_00 == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002da0c4;
        GetLastError();
        bVar7 = PAL_InitializeChakraCoreCalled;
        goto LAB_002d9e4d;
      }
      iVar2 = access(pcVar5,0);
      bVar7 = PAL_InitializeChakraCoreCalled;
    } while (iVar2 != 0);
LAB_002d9df0:
    if (nBufferLength_00 < nBufferLength) {
      if (lpBuffer == (LPSTR)0x0) {
        dwErrCode = 0x57;
      }
      else {
        eVar3 = strcpy_s(lpBuffer,(ulong)nBufferLength,pcVar5);
        if (eVar3 == 0) {
          if (lpFilePart != (LPSTR *)0x0) {
            pcVar5 = strrchr(lpBuffer,0x2f);
            *lpFilePart = pcVar5;
            if (pcVar5 == (char *)0x0) {
              fprintf(_stderr,"] %s %s:%d","SearchPathA",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                      ,0x52d);
              fprintf(_stderr,"no \'/\' in full path!\n");
            }
            else {
              *lpFilePart = pcVar5 + 1;
            }
          }
          goto LAB_002d9c99;
        }
        dwErrCode = 0xce;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002da0c4;
      goto LAB_002d9c8f;
    }
    nBufferLength_00 = nBufferLength_00 + 1;
  }
LAB_002d9c99:
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return nBufferLength_00;
    }
    __stack_chk_fail();
  }
LAB_002da0c4:
  abort();
}

Assistant:

DWORD
PALAPI
SearchPathA(
    IN LPCSTR lpPath,
    IN LPCSTR lpFileName,
    IN LPCSTR lpExtension,
    IN DWORD nBufferLength,
    OUT LPSTR lpBuffer,
    OUT LPSTR *lpFilePart
    )
{
    DWORD nRet = 0;
    CHAR * FullPath;
    size_t FullPathLength = 0;
    PathCharString FullPathPS;
    PathCharString CanonicalFullPathPS;
    CHAR * CanonicalFullPath;
    LPCSTR pPathStart;
    LPCSTR pPathEnd;
    size_t PathLength;
    size_t FileNameLength;
    DWORD length;
    DWORD dw;

    PERF_ENTRY(SearchPathA);
    ENTRY("SearchPathA(lpPath=%p (%s), lpFileName=%p (%s), lpExtension=%p, "
          "nBufferLength=%u, lpBuffer=%p, lpFilePart=%p)\n",
      lpPath,
      lpPath, lpFileName, lpFileName, lpExtension, nBufferLength, lpBuffer,
          lpFilePart);

    /* validate parameters */

    if(NULL == lpPath)
    {
        ASSERT("lpPath may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL == lpFileName)
    {
        ASSERT("lpFileName may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL != lpExtension)
    {
        ASSERT("lpExtension must be NULL, is %p instead\n", lpExtension);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    FileNameLength = strlen(lpFileName);

    /* special case : if file name contains absolute path, don't search the
       provided path */
    if('\\' == lpFileName[0] || '/' == lpFileName[0])
    {
        if(FileNameLength >= MAX_LONGPATH)
        {
            WARN("absolute file name <%s> is too long\n", lpFileName);
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }
        /* Canonicalize the path to deal with back-to-back '/', etc. */
        length = MAX_LONGPATH;
        CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(length);
        if (NULL == CanonicalFullPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        dw = GetFullPathNameA(lpFileName, length+1, CanonicalFullPath, NULL);
        CanonicalFullPathPS.CloseBuffer(dw);

        if (length+1 < dw)
        {
            CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(dw-1);
            if (NULL == CanonicalFullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameA(lpFileName, dw,
                                  CanonicalFullPath, NULL);
            CanonicalFullPathPS.CloseBuffer(dw);
        }

        if (dw == 0)
        {
            WARN("couldn't canonicalize path <%s>, error is %#x. failing.\n",
                 lpFileName, GetLastError());
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        /* see if the file exists */
        if(0 == access(CanonicalFullPath, F_OK))
        {
            /* found it */
            nRet = dw;
        }
    }
    else
    {
        LPCSTR pNextPath;

        pNextPath = lpPath;

        while (*pNextPath)
        {
            pPathStart = pNextPath;

            /* get a pointer to the end of the first path in pPathStart */
            pPathEnd = strchr(pPathStart, ':');
            if (!pPathEnd)
            {
                pPathEnd = pPathStart + strlen(pPathStart);
                /* we want to break out of the loop after this pass, so let
                   *pNextPath be '\0' */
                pNextPath = pPathEnd;
            }
            else
            {
                /* point to the next component in the path string */
                pNextPath = pPathEnd+1;
            }

            PathLength = pPathEnd-pPathStart;

            if (PathLength+FileNameLength+1 >= MAX_LONGPATH)
            {
                /* The path+'/'+file length is too long.  Skip it. */
                WARN("path component %.*s is too long, skipping it\n",
                     (int)PathLength, pPathStart);
                continue;
            }
            else if(0 == PathLength)
            {
                /* empty component : there were 2 consecutive ':' */
                continue;
            }

            /* Construct a pathname by concatenating one path from lpPath, '/'
               and lpFileName */
            FullPathLength = PathLength + FileNameLength;
            FullPath = FullPathPS.OpenStringBuffer(FullPathLength+1);
            if (NULL == FullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            memcpy(FullPath, pPathStart, PathLength);
            FullPath[PathLength] = '/';
            if (strcpy_s(&FullPath[PathLength+1], FullPathLength+1-PathLength, lpFileName) != SAFECRT_SUCCESS)
            {
                ERROR("strcpy_s failed!\n");
                SetLastError( ERROR_FILENAME_EXCED_RANGE );
                nRet = 0;
                goto done;
            }

            FullPathPS.CloseBuffer(FullPathLength+1);
            /* Canonicalize the path to deal with back-to-back '/', etc. */
            length = MAX_LONGPATH;
            CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(length);
            if (NULL == CanonicalFullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameA(FullPath, length+1,
                                  CanonicalFullPath, NULL);
            CanonicalFullPathPS.CloseBuffer(dw);

            if (length+1 < dw)
            {
                CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(dw-1);
                dw = GetFullPathNameA(FullPath, dw,
                                      CanonicalFullPath, NULL);
                CanonicalFullPathPS.CloseBuffer(dw);
            }

            if (dw == 0)
            {
                /* Call failed - possibly low memory.  Skip the path */
                WARN("couldn't canonicalize path <%s>, error is %#x. "
                     "skipping it\n", FullPath, GetLastError());
                continue;
            }

            /* see if the file exists */
            if(0 == access(CanonicalFullPath, F_OK))
            {
                /* found it */
                nRet = dw;
                break;
            }
        }
    }

    if (nRet == 0)
    {
       /* file not found anywhere; say so. in Windows, this always seems to say
          FILE_NOT_FOUND, even if path doesn't exist */
       SetLastError(ERROR_FILE_NOT_FOUND);
    }
    else
    {
        if (nRet < nBufferLength)
        {
            if(NULL == lpBuffer)
            {
                /* Windows merily crashes here, but let's not */
                ERROR("caller told us buffer size was %d, but buffer is NULL\n",
                      nBufferLength);
                SetLastError(ERROR_INVALID_PARAMETER);
                nRet = 0;
                goto done;
            }

            if (strcpy_s(lpBuffer, nBufferLength, CanonicalFullPath) != SAFECRT_SUCCESS)
            {
                ERROR("strcpy_s failed!\n");
                SetLastError( ERROR_FILENAME_EXCED_RANGE );
                nRet = 0;
                goto done;
            }

            if(NULL != lpFilePart)
            {
                *lpFilePart = strrchr(lpBuffer,'/');
                if(NULL == *lpFilePart)
                {
                    ASSERT("no '/' in full path!\n");
                }
                else
                {
                    /* point to character after last '/' */
                    (*lpFilePart)++;
                }
            }
        }
        else
        {
            /* if buffer is too small, report required length, including
               terminating null */
            nRet++;
        }
    }
done:
    LOGEXIT("SearchPathA returns DWORD %u\n", nRet);
    PERF_EXIT(SearchPathA);
    return nRet;
}